

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void Curl_persistconninfo(connectdata *conn)

{
  Curl_easy *pCVar1;
  Curl_handler *pCVar2;
  undefined8 uVar3;
  
  pCVar1 = conn->data;
  uVar3 = *(undefined8 *)(conn->primary_ip + 0x26);
  *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
  *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x26) = uVar3;
  uVar3 = *(undefined8 *)(conn->primary_ip + 0x18);
  *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x10) = *(undefined8 *)(conn->primary_ip + 0x10);
  *(undefined8 *)((pCVar1->info).conn_primary_ip + 0x18) = uVar3;
  uVar3 = *(undefined8 *)(conn->primary_ip + 8);
  *(undefined8 *)(pCVar1->info).conn_primary_ip = *(undefined8 *)conn->primary_ip;
  *(undefined8 *)((pCVar1->info).conn_primary_ip + 8) = uVar3;
  pCVar1 = conn->data;
  uVar3 = *(undefined8 *)(conn->local_ip + 0x18);
  *(undefined8 *)((pCVar1->info).conn_local_ip + 0x10) = *(undefined8 *)(conn->local_ip + 0x10);
  *(undefined8 *)((pCVar1->info).conn_local_ip + 0x18) = uVar3;
  uVar3 = *(undefined8 *)(conn->local_ip + 0x26);
  *(undefined8 *)((pCVar1->info).conn_local_ip + 0x1e) = *(undefined8 *)(conn->local_ip + 0x1e);
  *(undefined8 *)((pCVar1->info).conn_local_ip + 0x26) = uVar3;
  uVar3 = *(undefined8 *)(conn->local_ip + 8);
  *(undefined8 *)(pCVar1->info).conn_local_ip = *(undefined8 *)conn->local_ip;
  *(undefined8 *)((pCVar1->info).conn_local_ip + 8) = uVar3;
  pCVar2 = conn->handler;
  pCVar1 = conn->data;
  (pCVar1->info).conn_scheme = pCVar2->scheme;
  (pCVar1->info).conn_protocol = pCVar2->protocol;
  (pCVar1->info).conn_primary_port = conn->primary_port;
  (pCVar1->info).conn_local_port = conn->local_port;
  return;
}

Assistant:

void Curl_persistconninfo(struct connectdata *conn)
{
  memcpy(conn->data->info.conn_primary_ip, conn->primary_ip, MAX_IPADR_LEN);
  memcpy(conn->data->info.conn_local_ip, conn->local_ip, MAX_IPADR_LEN);
  conn->data->info.conn_scheme = conn->handler->scheme;
  conn->data->info.conn_protocol = conn->handler->protocol;
  conn->data->info.conn_primary_port = conn->primary_port;
  conn->data->info.conn_local_port = conn->local_port;
}